

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O2

CharFormat testing::internal::PrintAsCharLiteralTo<wchar_t,wchar_t>(wchar_t c,ostream *os)

{
  CharFormat CVar1;
  int in_EDX;
  char *pcVar2;
  long in_FS_OFFSET;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  switch((String *)(ulong)(uint)c) {
  case (String *)0x0:
    pcVar2 = "\\0";
    break;
  case (String *)0x1:
  case (String *)0x2:
  case (String *)0x3:
  case (String *)0x4:
  case (String *)0x5:
  case (String *)0x6:
switchD_0018946c_caseD_1:
    if ((uint)(c + L'\xffffffe0') < 0x5f) {
      std::operator<<(os,(char)c);
      CVar1 = kAsIs;
    }
    else {
      String::FormatHexInt_abi_cxx11_(&local_60,(String *)(ulong)(uint)c,in_EDX);
      std::operator+(&local_40,"\\x",&local_60);
      std::operator<<(os,(string *)&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_60);
      CVar1 = kHexEscape;
    }
    goto LAB_001894f3;
  case (String *)0x7:
    pcVar2 = "\\a";
    break;
  case (String *)0x8:
    pcVar2 = "\\b";
    break;
  case (String *)0x9:
    pcVar2 = "\\t";
    break;
  case (String *)0xa:
    pcVar2 = "\\n";
    break;
  case (String *)0xb:
    pcVar2 = "\\v";
    break;
  case (String *)0xc:
    pcVar2 = "\\f";
    break;
  case (String *)0xd:
    pcVar2 = "\\r";
    break;
  default:
    if (c == L'\'') {
      pcVar2 = "\\\'";
    }
    else {
      if (c != L'\\') goto switchD_0018946c_caseD_1;
      pcVar2 = "\\\\";
    }
  }
  std::operator<<(os,pcVar2);
  CVar1 = kSpecialEscape;
LAB_001894f3:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return CVar1;
}

Assistant:

static CharFormat PrintAsCharLiteralTo(Char c, ostream* os) {
			switch (static_cast<wchar_t>(c)) {
			case L'\0':
				*os << "\\0";
				break;
			case L'\'':
				*os << "\\'";
				break;
			case L'\\':
				*os << "\\\\";
				break;
			case L'\a':
				*os << "\\a";
				break;
			case L'\b':
				*os << "\\b";
				break;
			case L'\f':
				*os << "\\f";
				break;
			case L'\n':
				*os << "\\n";
				break;
			case L'\r':
				*os << "\\r";
				break;
			case L'\t':
				*os << "\\t";
				break;
			case L'\v':
				*os << "\\v";
				break;
			default:
				if (IsPrintableAscii(c)) {
					*os << static_cast<char>(c);
					return kAsIs;
				}
				else {
					*os << "\\x" + String::FormatHexInt(static_cast<UnsignedChar>(c));
					return kHexEscape;
				}
			}
			return kSpecialEscape;
		}